

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void __thiscall QWidget::setAccessibleName(QWidget *this,QString *name)

{
  bool bVar1;
  QWidgetPrivate *lhs;
  QString *in_RSI;
  QObject *in_RDI;
  long in_FS_OFFSET;
  QWidgetPrivate *d;
  QAccessibleEvent event;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  lhs = d_func((QWidget *)0x38018e);
  bVar1 = ::operator==((QString *)lhs,(QString *)in_RDI);
  if (!bVar1) {
    QString::operator=(&lhs->accessibleName,in_RSI);
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QAccessibleEvent::QAccessibleEvent((QAccessibleEvent *)&local_28,in_RDI,NameChanged);
    QAccessible::updateAccessibility((QAccessibleEvent *)&local_28);
    QAccessibleEvent::~QAccessibleEvent((QAccessibleEvent *)&local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidget::setAccessibleName(const QString &name)
{
    Q_D(QWidget);
    if (d->accessibleName == name)
        return;

    d->accessibleName = name;
    QAccessibleEvent event(this, QAccessible::NameChanged);
    QAccessible::updateAccessibility(&event);
}